

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeasurementFactory.cpp
# Opt level: O0

MeasurementFactory * MeasurementFactory::GetInstance(void)

{
  MeasurementFactory *this;
  
  if (instance_ == (MeasurementFactory *)0x0) {
    this = (MeasurementFactory *)operator_new(8);
    MeasurementFactory(this);
    instance_ = this;
  }
  return instance_;
}

Assistant:

MeasurementFactory *MeasurementFactory::GetInstance() {
    if (instance_ == 0)
	    instance_ = new MeasurementFactory();
    return instance_;
}